

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O0

uint64_t helper_bndldx64_x86_64(CPUX86State *env,target_ulong base,target_ulong ptr)

{
  uint64_t uVar1;
  uintptr_t unaff_retaddr;
  uint64_t pt;
  uint64_t ub;
  uint64_t lb;
  uint64_t bte;
  uintptr_t ra;
  target_ulong ptr_local;
  target_ulong base_local;
  CPUX86State *env_local;
  
  uVar1 = lookup_bte64(env,base,unaff_retaddr);
  ub = cpu_ldq_data_ra_x86_64(env,uVar1,unaff_retaddr);
  pt = cpu_ldq_data_ra_x86_64(env,uVar1 + 8,unaff_retaddr);
  uVar1 = cpu_ldq_data_ra_x86_64(env,uVar1 + 0x10,unaff_retaddr);
  if (uVar1 != ptr) {
    pt = 0;
    ub = 0;
  }
  (env->mmx_t0)._q_MMXReg[0] = pt;
  return ub;
}

Assistant:

uint64_t helper_bndldx64(CPUX86State *env, target_ulong base, target_ulong ptr)
{
    uintptr_t ra = GETPC();
    uint64_t bte, lb, ub, pt;

    bte = lookup_bte64(env, base, ra);
    lb = cpu_ldq_data_ra(env, bte, ra);
    ub = cpu_ldq_data_ra(env, bte + 8, ra);
    pt = cpu_ldq_data_ra(env, bte + 16, ra);

    if (pt != ptr) {
        lb = ub = 0;
    }
    env->mmx_t0.MMX_Q(0) = ub;
    return lb;
}